

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

string * __thiscall
bloaty::NameMunger::Munge_abi_cxx11_
          (string *__return_storage_ptr__,NameMunger *this,string_view name)

{
  pointer ppVar1;
  _Head_base<0UL,_bloaty::ReImpl_*,_false> re;
  pointer pcVar2;
  string *psVar3;
  bool bVar4;
  size_type *psVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer ppVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  string *local_98;
  long *local_90;
  size_type sStack_88;
  long local_80 [2];
  long *local_70;
  size_type sStack_68;
  long local_60 [2];
  StringPiece local_50;
  StringPiece local_40;
  
  pcVar6 = name._M_str;
  local_d8 = &local_c8;
  local_98 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar6,pcVar6 + name._M_len);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,pcVar6,pcVar6 + name._M_len);
  ppVar8 = (this->regexes_).
           super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->regexes_).
           super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar8 != ppVar1) {
    do {
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_d8,local_d8->_M_local_buf + local_d0);
      re._M_head_impl =
           (ppVar8->first)._M_t.
           super___uniq_ptr_impl<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::ReImpl_*,_std::default_delete<bloaty::ReImpl>_>.
           super__Head_base<0UL,_bloaty::ReImpl_*,_false>._M_head_impl;
      pcVar2 = (ppVar8->second)._M_dataplus._M_p;
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + (ppVar8->second)._M_string_length);
      local_40.data_ = (const_pointer)local_70;
      local_40.size_ = sStack_68;
      local_50.data_ = (const_pointer)local_90;
      local_50.size_ = sStack_88;
      bVar4 = re2::RE2::Extract(&local_40,&(re._M_head_impl)->re2_,&local_50,&local_b8);
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (bVar4) {
        (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
        paVar7 = &local_b8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar7) {
          (local_98->field_2)._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&local_98->field_2 + 8) = local_b8.field_2._8_8_;
        }
        else {
          (local_98->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
          (local_98->field_2)._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
        }
        psVar5 = &local_b8._M_string_length;
        local_98->_M_string_length = local_b8._M_string_length;
        local_b8._M_dataplus._M_p = (pointer)paVar7;
        goto LAB_0017c158;
      }
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar1);
  }
  (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
  paVar7 = &local_c8;
  if (local_d8 == paVar7) {
    (local_98->field_2)._M_allocated_capacity = local_c8._M_allocated_capacity;
    *(undefined8 *)((long)&local_98->field_2 + 8) = local_c8._8_8_;
  }
  else {
    (local_98->_M_dataplus)._M_p = (pointer)local_d8;
    (local_98->field_2)._M_allocated_capacity = local_c8._M_allocated_capacity;
  }
  psVar5 = &local_d0;
  local_98->_M_string_length = local_d0;
  local_d8 = paVar7;
LAB_0017c158:
  psVar3 = local_98;
  *psVar5 = 0;
  paVar7->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8._M_allocated_capacity + 1);
  }
  return psVar3;
}

Assistant:

std::string NameMunger::Munge(string_view name) const {
  std::string name_str(name);
  std::string ret(name);

  for (const auto& pair : regexes_) {
    if (ReImpl::Extract(name_str, *pair.first, pair.second, &ret)) {
      return ret;
    }
  }

  return name_str;
}